

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_bsdos(int n,unsigned_long *numbers,char **error)

{
  ulong uVar1;
  ulong local_28;
  dev_t dev;
  char **error_local;
  unsigned_long *numbers_local;
  int n_local;
  
  local_28 = 0;
  if (n == 2) {
    local_28 = (*numbers & 0xfff) << 0x14 | numbers[1] & 0xfffff;
    if ((long)(int)(*numbers & 0xfff) != *numbers) {
      *error = "invalid major number";
    }
    if ((long)(int)((uint)local_28 & 0xfffff) != numbers[1]) {
      *error = "invalid minor number";
    }
  }
  else if (n == 3) {
    uVar1 = (*numbers & 0xfff) << 0x14 | (numbers[1] & 0xfff) << 8;
    local_28 = uVar1 | numbers[2] & 0xff;
    if ((long)(int)(*numbers & 0xfff) != *numbers) {
      *error = "invalid major number";
    }
    if ((long)(int)((uint)(uVar1 >> 8) & 0xfff) != numbers[1]) {
      *error = "invalid unit number";
    }
    if ((long)(int)((uint)local_28 & 0xff) != numbers[2]) {
      *error = "invalid subunit number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return local_28;
}

Assistant:

static dev_t
pack_bsdos(int n, unsigned long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_12_20(numbers[0], numbers[1]);
		if ((unsigned long)major_12_20(dev) != numbers[0])
			*error = iMajorError;
		if ((unsigned long)minor_12_20(dev) != numbers[1])
			*error = iMinorError;
	} else if (n == 3) {
		dev = makedev_12_12_8(numbers[0], numbers[1], numbers[2]);
		if ((unsigned long)major_12_12_8(dev) != numbers[0])
			*error = iMajorError;
		if ((unsigned long)unit_12_12_8(dev) != numbers[1])
			*error = "invalid unit number";
		if ((unsigned long)subunit_12_12_8(dev) != numbers[2])
			*error = "invalid subunit number";
	} else
		*error = tooManyFields;
	return (dev);
}